

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFListTable.cpp
# Opt level: O2

void __thiscall
llvm::DWARFListTableHeader::dump(DWARFListTableHeader *this,raw_ostream *OS,DIDumpOptions DumpOpts)

{
  pointer puVar1;
  uint64_t uVar2;
  unsigned_long uVar3;
  byte bVar4;
  unsigned_long *Off;
  pointer puVar5;
  undefined **ppuVar6;
  format_object_base local_70;
  undefined8 local_60;
  uint64_t local_58;
  char *local_50;
  DWARFListTableHeader *local_48;
  _func_int **local_40;
  char local_31;
  
  local_31 = DumpOpts.Verbose;
  if (DumpOpts.Verbose == true) {
    local_70.Fmt = "0x%8.8lx: ";
    local_70._vptr_format_object_base = (_func_int **)&PTR_home_01127cf0;
    local_60 = this->HeaderOffset;
    raw_ostream::operator<<(OS,&local_70);
  }
  local_50 = (this->ListTypeString).Data;
  local_70.Fmt = 
  "%s list header: length = 0x%8.8lx, version = 0x%4.4x, addr_size = 0x%2.2x, seg_size = 0x%2.2x, offset_entry_count = 0x%8.8x\n"
  ;
  local_70._vptr_format_object_base = (_func_int **)&PTR_home_011287e8;
  local_60 = CONCAT26((this->HeaderData).Version,
                      CONCAT15((this->HeaderData).AddrSize,
                               CONCAT14((this->HeaderData).SegSize,
                                        (this->HeaderData).OffsetEntryCount)));
  local_58 = (this->HeaderData).Length;
  raw_ostream::operator<<(OS,&local_70);
  if ((this->HeaderData).OffsetEntryCount != 0) {
    raw_ostream::operator<<(OS,"offsets: [");
    puVar5 = (this->Offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    puVar1 = (this->Offsets).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    ppuVar6 = &PTR_home_01127cf0;
    local_40 = (_func_int **)&PTR_home_01127cf0;
    local_48 = this;
    for (; puVar5 != puVar1; puVar5 = puVar5 + 1) {
      local_70.Fmt = "\n0x%8.8lx";
      local_60 = *puVar5;
      local_70._vptr_format_object_base = (_func_int **)ppuVar6;
      raw_ostream::operator<<(OS,&local_70);
      if (local_31 != '\0') {
        uVar2 = local_48->HeaderOffset;
        uVar3 = *puVar5;
        bVar4 = getHeaderSize(local_48->Format);
        ppuVar6 = local_40;
        local_60 = (ulong)bVar4 + uVar2 + uVar3;
        local_70.Fmt = " => 0x%8.8lx";
        local_70._vptr_format_object_base = local_40;
        raw_ostream::operator<<(OS,&local_70);
      }
    }
    raw_ostream::operator<<(OS,"\n]\n");
  }
  return;
}

Assistant:

void DWARFListTableHeader::dump(raw_ostream &OS, DIDumpOptions DumpOpts) const {
  if (DumpOpts.Verbose)
    OS << format("0x%8.8" PRIx64 ": ", HeaderOffset);
  OS << format(
      "%s list header: length = 0x%8.8" PRIx64 ", version = 0x%4.4" PRIx16 ", "
      "addr_size = 0x%2.2" PRIx8 ", seg_size = 0x%2.2" PRIx8
      ", offset_entry_count = "
      "0x%8.8" PRIx32 "\n",
      ListTypeString.data(), HeaderData.Length, HeaderData.Version,
      HeaderData.AddrSize, HeaderData.SegSize, HeaderData.OffsetEntryCount);

  if (HeaderData.OffsetEntryCount > 0) {
    OS << "offsets: [";
    for (const auto &Off : Offsets) {
      OS << format("\n0x%8.8" PRIx64, Off);
      if (DumpOpts.Verbose)
        OS << format(" => 0x%8.8" PRIx64,
                     Off + HeaderOffset + getHeaderSize(Format));
    }
    OS << "\n]\n";
  }
}